

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_CutDsdBalancePinDelays_rec
              (If_DsdMan_t *p,int Id,int *pTimes,word *pRes,int *pnSupp,int nSuppAll,char *pPermLits
              )

{
  Vec_Wec_t *p_00;
  int t;
  int Lit;
  int iVar1;
  int iVar2;
  If_DsdObj_t *pObj;
  word *pwVar3;
  Vec_Int_t *vCover;
  word wVar4;
  word D2;
  uint uVar5;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int pCounter [15];
  word *local_b8 [2];
  word pFaninRes [15];
  
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,Id);
  uVar13 = *(uint *)&pObj->field_0x4;
  uVar5 = (uVar13 & 7) - 2;
  if (4 < uVar5) {
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x875,
                  "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                 );
  }
  pwVar6 = (word *)((long)&switchD_00386dbc::switchdataD_007d7258 +
                   (long)(int)(&switchD_00386dbc::switchdataD_007d7258)[uVar5]);
  switch(uVar13 & 7) {
  case 2:
    iVar1 = *pnSupp;
    *pnSupp = iVar1 + 1;
    uVar13 = Abc_Lit2Var((int)pPermLits[iVar1]);
    if (0xf < uVar13) {
      __assert_fail("v >= 0 && v < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                    ,0x92,"word If_CutPinDelayInit(int)");
    }
    *pRes = 1L << ((char)uVar13 * '\x04' & 0x3fU);
    iVar1 = pTimes[uVar13];
    break;
  default:
    local_b8[1] = (word *)pTimes;
    local_b8[0] = pRes;
    uVar7 = 0;
    uVar8 = 0;
    iVar1 = 0;
    while ((iVar2 = (int)uVar8, uVar7 < uVar13 >> 0x1b &&
           (Lit = If_DsdObjFaninLit(pObj,(int)uVar7), Lit != 0))) {
      iVar1 = Abc_Lit2Var(Lit);
      iVar1 = If_CutDsdBalancePinDelays_rec
                        (p,iVar1,(int *)local_b8[1],pFaninRes + uVar7,pnSupp,nSuppAll,pPermLits);
      pwVar6 = (word *)pFaninRes[uVar7];
      pFaninRes[iVar2] = (word)pwVar6;
      uVar13 = iVar2 + 1;
      pCounter[iVar2] = iVar1;
      if (0 < iVar2) {
        while (iVar1 = (int)uVar8, 0 < iVar1) {
          iVar2 = pCounter[uVar8];
          uVar12 = (ulong)(iVar1 - 1);
          uVar5 = pCounter[uVar12];
          pwVar6 = (word *)(ulong)uVar5;
          if (iVar2 < (int)uVar5) break;
          if ((int)uVar5 < iVar2) {
            pCounter[uVar8] = uVar5;
            pCounter[uVar12] = iVar2;
            wVar4 = pFaninRes[uVar8];
            pwVar6 = (word *)pFaninRes[uVar12];
            pFaninRes[uVar8] = (word)pwVar6;
            pFaninRes[uVar12] = wVar4;
            uVar8 = (ulong)(iVar1 - 1);
          }
          else {
            uVar5 = uVar5 + 1;
            pwVar6 = (word *)(ulong)uVar5;
            pCounter[uVar12] = uVar5;
            wVar4 = If_CutPinDelayMax(pFaninRes[uVar8],pFaninRes[uVar12],nSuppAll,uVar5);
            pFaninRes[uVar12] = wVar4;
            uVar13 = uVar13 - 1;
            uVar11 = uVar8;
            while( true ) {
              uVar10 = uVar11 + 1;
              iVar1 = (int)uVar8;
              uVar8 = uVar12;
              if ((int)uVar13 <= iVar1) break;
              pCounter[uVar11] = pCounter[uVar10];
              pFaninRes[uVar11] = pFaninRes[uVar10];
              uVar8 = (ulong)(iVar1 + 1);
              uVar11 = uVar10;
            }
          }
        }
      }
      uVar8 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        __assert_fail("nTimes > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0xe2,"int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)")
        ;
      }
      iVar1 = (uint)(uVar13 != 1) + pCounter[0];
      uVar7 = uVar7 + 1;
      uVar13 = *(uint *)&pObj->field_0x4;
    }
    pwVar9 = local_b8[0];
    if (iVar2 == 0) {
      __assert_fail("nCounter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x880,
                    "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                   );
    }
    for (; 1 < (long)uVar8; uVar8 = uVar8 - 1) {
      pwVar3 = (word *)If_CutPinDelayMax(pFaninRes[uVar8 - 1],(word)local_b8[uVar8],nSuppAll,
                                         (int)pwVar6);
      local_b8[uVar8] = pwVar3;
    }
    *pwVar9 = pFaninRes[0];
    break;
  case 5:
    pwVar9 = pFaninRes;
    uVar8 = 0;
    while ((iVar1 = (int)pwVar6, uVar8 < uVar13 >> 0x1b &&
           (iVar2 = If_DsdObjFaninLit(pObj,(int)uVar8), iVar2 != 0))) {
      iVar1 = Abc_Lit2Var(iVar2);
      pwVar6 = pwVar9;
      iVar1 = If_CutDsdBalancePinDelays_rec(p,iVar1,pTimes,pwVar9,pnSupp,nSuppAll,pPermLits);
      pCounter[uVar8] = iVar1;
      uVar8 = uVar8 + 1;
      uVar13 = *(uint *)&pObj->field_0x4;
      pwVar9 = pwVar9 + 1;
    }
    wVar4 = If_CutPinDelayMax(pFaninRes[0],pFaninRes[1],nSuppAll,iVar1);
    D2 = If_CutPinDelayMax(pFaninRes[0],pFaninRes[2],nSuppAll,iVar1);
    wVar4 = If_CutPinDelayMax(wVar4,D2,nSuppAll,iVar1);
    *pRes = wVar4;
    if (pCounter[2] < pCounter[1]) {
      pCounter[2] = pCounter[1];
    }
    if (pCounter[2] < pCounter[0]) {
      pCounter[2] = pCounter[0];
    }
    iVar1 = pCounter[2] + 2;
    break;
  case 6:
    p_00 = p->vIsops[uVar13 >> 0x1b];
    iVar1 = If_DsdObjTruthId(p,pObj);
    vCover = Vec_WecEntry(p_00,iVar1);
    if (vCover->nSize < 1) {
      __assert_fail("Vec_IntSize(vCover) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x870,
                    "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                   );
    }
    pwVar6 = pFaninRes;
    uVar8 = 0;
    while ((uVar8 < *(uint *)&pObj->field_0x4 >> 0x1b &&
           (iVar1 = If_DsdObjFaninLit(pObj,(int)uVar8), iVar1 != 0))) {
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = If_CutDsdBalancePinDelays_rec(p,iVar1,pTimes,pwVar6,pnSupp,nSuppAll,pPermLits);
      pCounter[uVar8] = iVar1;
      uVar8 = uVar8 + 1;
      pwVar6 = pwVar6 + 1;
    }
    iVar1 = If_CutSopBalancePinDelaysInt(vCover,pCounter,pFaninRes,nSuppAll,pRes);
  }
  return iVar1;
}

Assistant:

int If_CutDsdBalancePinDelays_rec( If_DsdMan_t * p, int Id, int * pTimes, word * pRes, int * pnSupp, int nSuppAll, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var(pPermLits[(*pnSupp)++]);
        *pRes = If_CutPinDelayInit(iCutVar);
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        word pFaninRes[3], Res0, Res1;
        int i, iFanin, Delays[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        Res0 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[1], nSuppAll, 1 );
        Res1 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[2], nSuppAll, 1 );
        *pRes = If_CutPinDelayMax( Res0, Res1, nSuppAll, 1 );
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        assert( Vec_IntSize(vCover) > 0 );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        return If_CutSopBalancePinDelaysInt( vCover, Delays, pFaninRes, nSuppAll, pRes );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
            Result = If_LogCounterPinDelays( pCounter, &nCounter, pFaninRes, Delay, pFaninRes[i], nSuppAll, fXor );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        *pRes = If_LogPinDelaysMulti( pFaninRes, nCounter, nSuppAll, fXor );
        return Result;
    }
}